

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_entities(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  int test_ret;
  
  if (quiet == 0) {
    printf("Testing entities : 13 of 17 functions ...\n");
  }
  iVar1 = test_xmlAddDocEntity();
  iVar2 = test_xmlAddDtdEntity();
  iVar3 = test_xmlCleanupPredefinedEntities();
  iVar4 = test_xmlCopyEntitiesTable();
  iVar5 = test_xmlCreateEntitiesTable();
  iVar6 = test_xmlDumpEntitiesTable();
  iVar7 = test_xmlDumpEntityDecl();
  iVar8 = test_xmlEncodeEntitiesReentrant();
  iVar9 = test_xmlEncodeSpecialChars();
  iVar10 = test_xmlGetDocEntity();
  iVar11 = test_xmlGetDtdEntity();
  iVar12 = test_xmlGetParameterEntity();
  iVar13 = test_xmlGetPredefinedEntity();
  iVar14 = test_xmlInitializePredefinedEntities();
  iVar15 = test_xmlNewEntity();
  uVar16 = iVar15 + iVar14 + iVar13 + iVar12 + iVar11 + iVar10 + iVar9 + iVar8 + iVar7 + iVar6 + 
                                                  iVar5 + iVar4 + iVar3 + iVar2 + iVar1;
  if (uVar16 != 0) {
    printf("Module entities: %d errors\n",(ulong)uVar16);
  }
  return uVar16;
}

Assistant:

static int
test_entities(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing entities : 13 of 17 functions ...\n");
    test_ret += test_xmlAddDocEntity();
    test_ret += test_xmlAddDtdEntity();
    test_ret += test_xmlCleanupPredefinedEntities();
    test_ret += test_xmlCopyEntitiesTable();
    test_ret += test_xmlCreateEntitiesTable();
    test_ret += test_xmlDumpEntitiesTable();
    test_ret += test_xmlDumpEntityDecl();
    test_ret += test_xmlEncodeEntitiesReentrant();
    test_ret += test_xmlEncodeSpecialChars();
    test_ret += test_xmlGetDocEntity();
    test_ret += test_xmlGetDtdEntity();
    test_ret += test_xmlGetParameterEntity();
    test_ret += test_xmlGetPredefinedEntity();
    test_ret += test_xmlInitializePredefinedEntities();
    test_ret += test_xmlNewEntity();

    if (test_ret != 0)
	printf("Module entities: %d errors\n", test_ret);
    return(test_ret);
}